

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

int SaveBinary3dos(path *fname,aint start,aint length,byte type,word w2,word w3)

{
  int iVar1;
  FILE *__s;
  size_t sVar2;
  long lVar3;
  undefined8 *puVar4;
  byte *pbVar5;
  byte bVar6;
  byte p3dos_header [128];
  
  bVar6 = 0;
  __s = (FILE *)SJ_fopen(fname,"wb");
  if (__s == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string((string *)p3dos_header,fname);
    Error("opening file for write",(char *)p3dos_header._0_8_,FATAL);
    std::__cxx11::string::~string((string *)p3dos_header);
  }
  puVar4 = &DAT_0015f200;
  pbVar5 = p3dos_header;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)pbVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    pbVar5 = pbVar5 + (ulong)bVar6 * -0x10 + 8;
  }
  iVar1 = length + 0x80;
  p3dos_header[0xb] = (byte)iVar1;
  p3dos_header[0xc] = (byte)((uint)iVar1 >> 8);
  p3dos_header[0xd] = (byte)((uint)iVar1 >> 0x10);
  p3dos_header[0xe] = (byte)((uint)iVar1 >> 0x18);
  p3dos_header[0xf] = type;
  p3dos_header[0x10] = (byte)length;
  p3dos_header[0x11] = (byte)((uint)length >> 8);
  p3dos_header._18_2_ = w2;
  p3dos_header._20_2_ = w3;
  p3dos_header[0x7f] = '\0';
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
    p3dos_header[0x7f] = p3dos_header[0x7f] + p3dos_header[lVar3];
  }
  sVar2 = fwrite(p3dos_header,1,0x80,__s);
  iVar1 = 0;
  if ((int)sVar2 == 0x80) {
    iVar1 = SaveRAM((FILE *)__s,start,length);
  }
  fclose(__s);
  return iVar1;
}

Assistant:

int SaveBinary3dos(const std::filesystem::path & fname, aint start, aint length, byte type, word w2, word w3) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) Error("opening file for write", fname.string().c_str(), FATAL);
	// prepare +3DOS 128 byte header content
	constexpr aint hsize = 128;
	const aint full_length = hsize + length;
	byte sum = 0, p3dos_header[hsize] { "PLUS3DOS\032\001" };
	p3dos_header[11] = byte(full_length>>0);
	p3dos_header[12] = byte(full_length>>8);
	p3dos_header[13] = byte(full_length>>16);
	p3dos_header[14] = byte(full_length>>24);
	// +3 BASIC 8 byte header filled with "relevant values"
	p3dos_header[15+0] = type;
	p3dos_header[15+1] = byte(length>>0);
	p3dos_header[15+2] = byte(length>>8);
	p3dos_header[15+3] = byte(w2>>0);
	p3dos_header[15+4] = byte(w2>>8);
	p3dos_header[15+5] = byte(w3>>0);
	p3dos_header[15+6] = byte(w3>>8);
	// calculat checksum of the header
	for (const byte v : p3dos_header) sum += v;
	p3dos_header[hsize-1] = sum;
	// write header and data
	int result = (hsize == (aint) fwrite(p3dos_header, 1, hsize, ff)) ? SaveRAM(ff, start, length) : 0;
	fclose(ff);
	return result;
}